

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

OptionBase<Kernel::PolyNf> * __thiscall
Lib::OptionBase<Kernel::PolyNf>::operator=
          (OptionBase<Kernel::PolyNf> *this,OptionBase<Kernel::PolyNf> *other)

{
  byte *in_RSI;
  OptionBase<Kernel::PolyNf> *in_RDI;
  MaybeUninit<Kernel::PolyNf> *this_00;
  EVP_PKEY_CTX local_28 [24];
  byte *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->_isSome & 1U) != 0) {
    unwrap((OptionBase<Kernel::PolyNf> *)0x715417);
  }
  if ((*local_10 & 1) != 0) {
    this_00 = &in_RDI->_elem;
    unwrap((OptionBase<Kernel::PolyNf> *)0x715438);
    move_if_value<Kernel::PolyNf,_true>((PolyNf *)this_00);
    MaybeUninit<Kernel::PolyNf>::init(this_00,local_28);
  }
  in_RDI->_isSome = (bool)(*local_10 & 1);
  return in_RDI;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }